

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O2

int32_t __thiscall icu_63::CollationData::getGroupForPrimary(CollationData *this,uint32_t p)

{
  uint uVar1;
  uint16_t *puVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  puVar2 = this->scriptStarts;
  if (((uint)puVar2[1] <= p >> 0x10) &&
     (p >> 0x10 < (uint)puVar2[(long)this->scriptStartsLength + -1])) {
    uVar5 = 0;
    do {
      uVar3 = uVar5 + 1;
      lVar4 = uVar5 + 2;
      uVar5 = uVar3;
    } while (puVar2[lVar4] <= (ushort)(p >> 0x10));
    uVar1 = this->numScripts;
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      if (this->scriptsIndex[uVar5] == uVar3) {
        return (int32_t)uVar5;
      }
    }
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      if (this->scriptsIndex[(int)uVar1 + lVar4] == uVar3) {
        return (int)lVar4 + 0x1000;
      }
    }
  }
  return -1;
}

Assistant:

int32_t
CollationData::getGroupForPrimary(uint32_t p) const {
    p >>= 16;
    if(p < scriptStarts[1] || scriptStarts[scriptStartsLength - 1] <= p) {
        return -1;
    }
    int32_t index = 1;
    while(p >= scriptStarts[index + 1]) { ++index; }
    for(int32_t i = 0; i < numScripts; ++i) {
        if(scriptsIndex[i] == index) {
            return i;
        }
    }
    for(int32_t i = 0; i < MAX_NUM_SPECIAL_REORDER_CODES; ++i) {
        if(scriptsIndex[numScripts + i] == index) {
            return UCOL_REORDER_CODE_FIRST + i;
        }
    }
    return -1;
}